

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_57514da::BIP32PubkeyProvider::GetDerivedExtKey
          (BIP32PubkeyProvider *this,SigningProvider *arg,CExtKey *xprv,CExtKey *last_hardened)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  undefined3 uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  bool bVar17;
  uint *puVar18;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar17 = GetExtKey(this,arg,xprv);
  if (bVar17) {
    puVar18 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar3 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar18 == puVar3) {
      bVar17 = true;
    }
    else {
      do {
        uVar1 = *puVar18;
        bVar17 = CExtKey::Derive(xprv,xprv,uVar1);
        if (!bVar17) break;
        if ((int)uVar1 < 0) {
          uVar7 = xprv->nDepth;
          uVar8 = xprv->vchFingerprint[0];
          uVar9 = xprv->vchFingerprint[1];
          uVar10 = xprv->vchFingerprint[2];
          uVar11 = xprv->vchFingerprint[3];
          uVar12 = *(undefined3 *)&xprv->field_0x5;
          uVar1 = xprv->nChild;
          uVar13 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[0];
          uVar14 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[1];
          uVar15 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[2];
          uVar16 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[3];
          uVar4 = *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 4);
          uVar5 = *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc);
          uVar6 = *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18);
          *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) =
               *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10);
          *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) =
               uVar6;
          *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 4) =
               uVar4;
          *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc) =
               uVar5;
          last_hardened->nDepth = uVar7;
          last_hardened->vchFingerprint[0] = uVar8;
          last_hardened->vchFingerprint[1] = uVar9;
          last_hardened->vchFingerprint[2] = uVar10;
          last_hardened->vchFingerprint[3] = uVar11;
          *(undefined3 *)&last_hardened->field_0x5 = uVar12;
          last_hardened->nChild = uVar1;
          (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[0] = uVar13;
          (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[1] = uVar14;
          (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[2] = uVar15;
          (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[3] = uVar16;
          CKey::operator=(&last_hardened->key,&xprv->key);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar3);
    }
  }
  else {
    bVar17 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar17;
}

Assistant:

bool GetDerivedExtKey(const SigningProvider& arg, CExtKey& xprv, CExtKey& last_hardened) const
    {
        if (!GetExtKey(arg, xprv)) return false;
        for (auto entry : m_path) {
            if (!xprv.Derive(xprv, entry)) return false;
            if (entry >> 31) {
                last_hardened = xprv;
            }
        }
        return true;
    }